

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMatrix3x3.h
# Opt level: O0

btMatrix3x3 * __thiscall btMatrix3x3::inverse(btMatrix3x3 *this)

{
  btVector3 *this_00;
  btScalar *pbVar1;
  btScalar *unaff_RBX;
  btMatrix3x3 *in_RSI;
  btMatrix3x3 *in_RDI;
  btScalar bVar2;
  btScalar bVar3;
  float fVar4;
  float fVar5;
  btScalar bVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  btScalar s;
  btScalar det;
  btVector3 co;
  undefined8 in_stack_ffffffffffffff80;
  btMatrix3x3 *this_01;
  btScalar local_30;
  btScalar local_2c [3];
  btScalar *in_stack_ffffffffffffffe0;
  btMatrix3x3 *zx;
  btMatrix3x3 *zy;
  
  this_01 = in_RDI;
  zx = in_RSI;
  zy = in_RDI;
  local_2c[0] = cofac(in_RDI,(int)((ulong)in_RSI >> 0x20),(int)in_RSI,
                      (int)((ulong)in_stack_ffffffffffffff80 >> 0x20),(int)in_stack_ffffffffffffff80
                     );
  local_30 = cofac(this_01,(int)((ulong)in_RSI >> 0x20),(int)in_RSI,
                   (int)((ulong)in_stack_ffffffffffffff80 >> 0x20),(int)in_stack_ffffffffffffff80);
  bVar2 = cofac(this_01,(int)((ulong)in_RSI >> 0x20),(int)in_RSI,
                (int)((ulong)in_stack_ffffffffffffff80 >> 0x20),(int)in_stack_ffffffffffffff80);
  btVector3::btVector3
            ((btVector3 *)(local_2c + 1),local_2c,&local_30,(btScalar *)&stack0xffffffffffffffcc);
  this_00 = operator[](in_RSI,0);
  bVar3 = btVector3::dot(this_00,(btVector3 *)(local_2c + 1));
  fVar4 = 1.0 / bVar3;
  pbVar1 = btVector3::x((btVector3 *)(local_2c + 1));
  fVar5 = *pbVar1 * fVar4;
  bVar6 = cofac(this_01,(int)((ulong)in_RSI >> 0x20),(int)in_RSI,
                (int)((ulong)in_stack_ffffffffffffff80 >> 0x20),(int)in_stack_ffffffffffffff80);
  fVar7 = bVar6 * fVar4;
  bVar6 = cofac(this_01,(int)((ulong)in_RSI >> 0x20),(int)in_RSI,
                (int)((ulong)in_stack_ffffffffffffff80 >> 0x20),(int)in_stack_ffffffffffffff80);
  fVar8 = bVar6 * fVar4;
  pbVar1 = btVector3::y((btVector3 *)(local_2c + 1));
  fVar9 = *pbVar1 * fVar4;
  bVar6 = cofac(this_01,(int)((ulong)in_RSI >> 0x20),(int)in_RSI,
                (int)((ulong)in_stack_ffffffffffffff80 >> 0x20),(int)in_stack_ffffffffffffff80);
  fVar10 = bVar6 * fVar4;
  bVar6 = cofac(this_01,(int)((ulong)in_RSI >> 0x20),(int)in_RSI,
                (int)((ulong)in_stack_ffffffffffffff80 >> 0x20),(int)in_stack_ffffffffffffff80);
  fVar11 = bVar6 * fVar4;
  pbVar1 = btVector3::z((btVector3 *)(local_2c + 1));
  fVar12 = *pbVar1 * fVar4;
  bVar6 = cofac(this_01,(int)((ulong)in_RSI >> 0x20),(int)in_RSI,
                (int)((ulong)in_stack_ffffffffffffff80 >> 0x20),(int)in_stack_ffffffffffffff80);
  fVar13 = bVar6 * fVar4;
  bVar6 = cofac(this_01,(int)((ulong)in_RSI >> 0x20),(int)in_RSI,
                (int)((ulong)in_stack_ffffffffffffff80 >> 0x20),(int)in_stack_ffffffffffffff80);
  btMatrix3x3((btMatrix3x3 *)CONCAT44(bVar2,bVar3),(btScalar *)CONCAT44(fVar4,fVar5),
              (btScalar *)CONCAT44(fVar7,fVar8),(btScalar *)CONCAT44(fVar9,fVar10),
              (btScalar *)CONCAT44(fVar11,fVar12),(btScalar *)CONCAT44(fVar13,bVar6 * fVar4),
              in_stack_ffffffffffffffe0,(btScalar *)zx,(btScalar *)zy,unaff_RBX);
  return in_RDI;
}

Assistant:

SIMD_FORCE_INLINE btMatrix3x3 
btMatrix3x3::inverse() const
{
	btVector3 co(cofac(1, 1, 2, 2), cofac(1, 2, 2, 0), cofac(1, 0, 2, 1));
	btScalar det = (*this)[0].dot(co);
	btFullAssert(det != btScalar(0.0));
	btScalar s = btScalar(1.0) / det;
	return btMatrix3x3(co.x() * s, cofac(0, 2, 2, 1) * s, cofac(0, 1, 1, 2) * s,
		co.y() * s, cofac(0, 0, 2, 2) * s, cofac(0, 2, 1, 0) * s,
		co.z() * s, cofac(0, 1, 2, 0) * s, cofac(0, 0, 1, 1) * s);
}